

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDebugger.cpp
# Opt level: O0

void __thiscall moira::Guards::removeAt(Guards *this,u32 addr)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int in_ESI;
  long *in_RDI;
  int j;
  int i;
  int local_14;
  int local_10;
  
  local_10 = 0;
  while( true ) {
    if (in_RDI[4] <= (long)local_10) goto LAB_002e814e;
    if (*(int *)(in_RDI[3] + (long)local_10 * 0x18) == in_ESI) break;
    local_10 = local_10 + 1;
  }
  for (local_14 = local_10; (long)(local_14 + 1) < in_RDI[4]; local_14 = local_14 + 1) {
    puVar2 = (undefined8 *)(in_RDI[3] + (long)(local_14 + 1) * 0x18);
    puVar1 = (undefined8 *)(in_RDI[3] + (long)local_14 * 0x18);
    *puVar1 = *puVar2;
    puVar1[1] = puVar2[1];
    puVar1[2] = puVar2[2];
  }
  in_RDI[4] = in_RDI[4] + -1;
LAB_002e814e:
  (**(code **)(*in_RDI + 0x10))(in_RDI,in_RDI[4] != 0);
  return;
}

Assistant:

void
Guards::removeAt(u32 addr)
{
    for (int i = 0; i < count; i++) {

        if (guards[i].addr == addr) {

            for (int j = i; j + 1 < count; j++) guards[j] = guards[j + 1];
            count--;
            break;
        }
    }
    setNeedsCheck(count != 0);
}